

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  void *pvVar1;
  string *initial_value;
  uint uVar2;
  EnumOptions *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumDescriptorProto_00425d10;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->value_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->value_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->value_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->value_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
            (&(this->value_).super_RepeatedPtrFieldBase,&(from->value_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if (((uVar2 & 1) != 0) &&
     (initial_value = (from->name_).ptr_,
     initial_value != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 2) == 0) {
    this_00 = (EnumOptions *)0x0;
  }
  else {
    this_00 = (EnumOptions *)operator_new(0x70);
    EnumOptions::EnumOptions(this_00,from->options_);
  }
  this->options_ = this_00;
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto(const EnumDescriptorProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      value_(from.value_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_options()) {
    options_ = new ::google::protobuf::EnumOptions(*from.options_);
  } else {
    options_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumDescriptorProto)
}